

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ge_bytes(void)

{
  int iVar1;
  secp256k1_ge q;
  secp256k1_ge p;
  uchar buf [64];
  int i;
  secp256k1_ge *in_stack_fffffffffffffee8;
  secp256k1_ge *in_stack_fffffffffffffef0;
  secp256k1_ge *in_stack_ffffffffffffff10;
  secp256k1_ge *in_stack_ffffffffffffff18;
  secp256k1_ge *in_stack_ffffffffffffff20;
  secp256k1_ge *in_stack_ffffffffffffff28;
  secp256k1_ge *in_stack_ffffffffffffff30;
  int local_4;
  
  local_4 = 0;
  do {
    if (COUNT + 1 <= local_4) {
      return;
    }
    if (local_4 == 0) {
      secp256k1_ge_set_infinity((secp256k1_ge *)0x1429fe);
    }
    else {
      testutil_random_ge_test(in_stack_ffffffffffffff20);
    }
    iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x142a14);
    if (iVar1 == 0) {
      secp256k1_ge_to_bytes((uchar *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      secp256k1_ge_from_bytes(in_stack_ffffffffffffff30,(uchar *)in_stack_ffffffffffffff28);
      iVar1 = secp256k1_ge_eq_var(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
                ,0xfa1,"test condition failed: secp256k1_ge_eq_var(&p, &q)");
        abort();
      }
      secp256k1_ge_from_bytes_ext(in_stack_fffffffffffffef0,(uchar *)in_stack_fffffffffffffee8);
      iVar1 = secp256k1_ge_eq_var(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
                ,0xfa4,"test condition failed: secp256k1_ge_eq_var(&p, &q)");
        abort();
      }
    }
    secp256k1_ge_to_bytes_ext((uchar *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    secp256k1_ge_from_bytes_ext(in_stack_fffffffffffffef0,(uchar *)in_stack_fffffffffffffee8);
    iVar1 = secp256k1_ge_eq_var(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
              ,0xfa8,"test condition failed: secp256k1_ge_eq_var(&p, &q)");
      abort();
    }
    local_4 = local_4 + 1;
  } while( true );
}

Assistant:

static void test_ge_bytes(void) {
    int i;

    for (i = 0; i < COUNT + 1; i++) {
        unsigned char buf[64];
        secp256k1_ge p, q;

        if (i == 0) {
            secp256k1_ge_set_infinity(&p);
        } else {
            testutil_random_ge_test(&p);
        }

        if (!secp256k1_ge_is_infinity(&p)) {
            secp256k1_ge_to_bytes(buf, &p);

            secp256k1_ge_from_bytes(&q, buf);
            CHECK(secp256k1_ge_eq_var(&p, &q));

            secp256k1_ge_from_bytes_ext(&q, buf);
            CHECK(secp256k1_ge_eq_var(&p, &q));
        }
        secp256k1_ge_to_bytes_ext(buf, &p);
        secp256k1_ge_from_bytes_ext(&q, buf);
        CHECK(secp256k1_ge_eq_var(&p, &q));
    }
}